

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader.c
# Opt level: O1

int loader_execution_path(char *tag,char *path)

{
  int iVar1;
  plugin p;
  loader_impl impl;
  
  iVar1 = loader_initialize();
  if (iVar1 == 0) {
    p = loader_get_impl_plugin(tag);
    if (p != (plugin)0x0) {
      impl = (loader_impl)plugin_impl(p);
      iVar1 = loader_impl_execution_path(p,impl,path);
      return iVar1;
    }
    log_write_impl_va("metacall",0x13f,"loader_execution_path",
                      "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/loader/source/loader.c"
                      ,LOG_LEVEL_ERROR,
                      "Tried to define an execution path from non existent loader (%s): %s",tag,path
                     );
  }
  return 1;
}

Assistant:

int loader_execution_path(const loader_tag tag, const loader_path path)
{
	if (loader_initialize() == 1)
	{
		return 1;
	}

	plugin p = loader_get_impl_plugin(tag);

	if (p == NULL)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Tried to define an execution path from non existent loader (%s): %s", tag, path);
		return 1;
	}

	/* TODO: Disable logs here until log is completely thread safe and async signal safe */
	/* log_write("metacall", LOG_LEVEL_DEBUG, "Define execution path (%s): %s", tag, path); */

	return loader_impl_execution_path(p, plugin_impl_type(p, loader_impl), path);
}